

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O3

void __thiscall
miniros::Publication::addSubscriberLink(Publication *this,SubscriberLinkPtr *sub_link)

{
  mutex *__mutex;
  element_type *peVar1;
  int iVar2;
  
  __mutex = &this->subscriber_links_mutex_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (this->dropped_ != false) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::
  vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  ::push_back(&this->subscriber_links_,sub_link);
  iVar2 = (*((sub_link->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_SubscriberLink[6])();
  if ((char)iVar2 != '\0') {
    this->intraprocess_subscriber_count_ = this->intraprocess_subscriber_count_ + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if ((this->latch_ == true) &&
     ((this->last_message_).buf.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0)) {
    peVar1 = (sub_link->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*peVar1->_vptr_SubscriberLink[2])(peVar1,&this->last_message_,1,1);
  }
  peerConnect(this,sub_link);
  return;
}

Assistant:

void Publication::addSubscriberLink(const SubscriberLinkPtr& sub_link)
{
  {
    std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);

    if (dropped_)
    {
      return;
    }

    subscriber_links_.push_back(sub_link);

    if (sub_link->isIntraprocess())
    {
      ++intraprocess_subscriber_count_;
    }
  }

  if (latch_ && last_message_.buf)
  {
    sub_link->enqueueMessage(last_message_, true, true);
  }

  // This call invokes the subscribe callback if there is one.
  // This must happen *after* the push_back above, in case the
  // callback uses publish().
  peerConnect(sub_link);
}